

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode LocalizedText_decodeBinary(UA_LocalizedText *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  byte bVar3;
  
  UVar2 = 0;
  if (end < pos + 1) {
    UVar2 = 0x80070000;
    bVar3 = 0;
  }
  else {
    bVar3 = *pos;
    pos = pos + 1;
  }
  if ((bVar3 & 1) != 0) {
    UVar1 = Array_decodeBinary(&(dst->locale).data,(size_t *)dst,UA_TYPES + 2);
    UVar2 = UVar2 | UVar1;
  }
  if ((bVar3 & 2) != 0) {
    UVar1 = Array_decodeBinary(&(dst->text).data,&(dst->text).length,UA_TYPES + 2);
    UVar2 = UVar2 | UVar1;
  }
  return UVar2;
}

Assistant:

static UA_StatusCode
LocalizedText_decodeBinary(UA_LocalizedText *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encoding = 0;
    UA_StatusCode retval = Byte_decodeBinary(&encoding, NULL);

    /* Decode the content */
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE)
        retval |= String_decodeBinary(&dst->locale, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT)
        retval |= String_decodeBinary(&dst->text, NULL);
    return retval;
}